

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O2

void __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingSolver
          (MultipleShootingSolver *this,
          shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem> *ocProblem)

{
  MultipleShootingTranscription *pMVar1;
  __shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2> local_40
  ;
  __shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2> local_30
  ;
  
  std::__shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_30,
               &ocProblem->
                super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>
              );
  OptimalControlSolver::OptimalControlSolver
            (&this->super_OptimalControlSolver,
             (shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem> *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  (this->super_OptimalControlSolver)._vptr_OptimalControlSolver =
       (_func_int **)&PTR__MultipleShootingSolver_001d3c38;
  (this->m_transcription).
  super___shared_ptr<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->m_transcription).
  super___shared_ptr<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_optimizer).
  super___shared_ptr<iDynTree::optimization::Optimizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_optimizer).
  super___shared_ptr<iDynTree::optimization::Optimizer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pMVar1 = (MultipleShootingTranscription *)operator_new(0xa80);
  MultipleShootingTranscription::MultipleShootingTranscription(pMVar1);
  std::
  __shared_ptr<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2>
  ::reset<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription>
            (&(this->m_transcription).
              super___shared_ptr<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2>
             ,pMVar1);
  pMVar1 = (this->m_transcription).
           super___shared_ptr<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_40,
               &ocProblem->
                super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>
              );
  MultipleShootingTranscription::setOptimalControlProblem
            (pMVar1,(shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return;
}

Assistant:

MultipleShootingSolver::MultipleShootingSolver(const std::shared_ptr<OptimalControlProblem> &ocProblem)
        : OptimalControlSolver(ocProblem)
        {
            m_transcription.reset(new MultipleShootingTranscription());
            assert(m_transcription);
            m_transcription->setOptimalControlProblem(ocProblem);
        }